

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int next_token(parse_state *state)

{
  int iVar1;
  int t;
  byte *pbVar2;
  byte *pbVar3;
  byte bVar4;
  byte *pbVar5;
  long lVar6;
  
  iVar1 = state->nexttoken;
  if (iVar1 != 0) {
    state->nexttoken = 0;
    return iVar1;
  }
  pbVar2 = (byte *)state->ptr;
  do {
    bVar4 = *pbVar2;
    if (bVar4 < 0xd) {
      if (bVar4 != 9) {
        if (bVar4 == 0) {
LAB_00106a07:
          state->ptr = (char *)pbVar2;
          return 0;
        }
        if (bVar4 != 10) goto LAB_001068f9;
        state->line = state->line + 1;
        pbVar2 = pbVar2 + 1;
        goto LAB_001068f0;
      }
    }
    else if ((bVar4 != 0xd) && (bVar4 != 0x20)) break;
    pbVar2 = pbVar2 + 1;
  } while( true );
  if (bVar4 == 0x23) {
    while ((bVar4 != 0 && (bVar4 != 10))) {
      pbVar5 = pbVar2 + 1;
      pbVar2 = pbVar2 + 1;
      bVar4 = *pbVar5;
    }
    state->line = state->line + 1;
LAB_001068f0:
    state->ptr = (char *)pbVar2;
    return 2;
  }
LAB_001068f9:
  state->text = (char *)pbVar2;
  pbVar5 = pbVar2;
LAB_00106900:
  do {
    bVar4 = *pbVar2;
    lVar6 = 1;
    while (pbVar3 = pbVar2, bVar4 == 0x5c) {
      bVar4 = pbVar3[1];
      if (bVar4 < 0xd) {
        if (bVar4 == 10) goto LAB_00106950;
        if (bVar4 != 0) goto LAB_001069e7;
        goto LAB_00106a14;
      }
      if (0x5b < bVar4) {
        if (bVar4 < 0x72) {
          if (bVar4 == 0x5c) goto LAB_001069f9;
          if (bVar4 == 0x6e) {
            bVar4 = 10;
            goto LAB_001069f9;
          }
        }
        else {
          if (bVar4 == 0x72) {
            bVar4 = 0xd;
            goto LAB_001069f9;
          }
          if (bVar4 == 0x74) {
            bVar4 = 9;
            goto LAB_001069f9;
          }
        }
LAB_001069e7:
        lVar6 = 2;
        goto LAB_001069f9;
      }
      if (bVar4 != 0xd) goto LAB_001069e7;
      bVar4 = pbVar3[2];
      pbVar2 = pbVar3 + 2;
      if (bVar4 == 10) {
LAB_00106950:
        state->line = state->line + 1;
        for (pbVar2 = pbVar3 + 2; (bVar4 = *pbVar2, bVar4 == 0x20 || (bVar4 == 9));
            pbVar2 = pbVar2 + 1) {
        }
      }
    }
    if (bVar4 < 0xd) {
      if (bVar4 == 0) goto LAB_00106a17;
      if (bVar4 == 9) goto LAB_00106a14;
      if (bVar4 == 10) {
        state->nexttoken = 2;
LAB_00106a14:
        pbVar3 = pbVar3 + 1;
LAB_00106a17:
        state->ptr = (char *)pbVar3;
        *pbVar5 = 0;
        return 1;
      }
    }
    else {
      if ((bVar4 == 0xd) || (bVar4 == 0x20)) goto LAB_00106a14;
      if (bVar4 == 0x22) {
        while( true ) {
          pbVar2 = pbVar3 + 1;
          bVar4 = *pbVar2;
          if (bVar4 == 0x22) break;
          if (bVar4 == 0) goto LAB_00106a07;
          *pbVar5 = bVar4;
          pbVar5 = pbVar5 + 1;
          pbVar3 = pbVar2;
        }
        pbVar2 = pbVar3 + 2;
        goto LAB_00106900;
      }
    }
LAB_001069f9:
    pbVar2 = pbVar3 + lVar6;
    *pbVar5 = bVar4;
    pbVar5 = pbVar5 + 1;
  } while( true );
}

Assistant:

int next_token(struct parse_state *state)
{
    char *x = state->ptr;
    char *s;

    if (state->nexttoken) {
        int t = state->nexttoken;
        state->nexttoken = 0;
        return t;
    }

    for (;;) {
        switch (*x) {
        case 0:
            state->ptr = x;
            return T_EOF;
        case '\n':
            state->line++;
            x++;
            state->ptr = x;
            return T_NEWLINE;
        case ' ':
        case '\t':
        case '\r':
            x++;
            continue;
        case '#':
            while (*x && (*x != '\n')) x++;
            state->line++;
            state->ptr = x;
            return T_NEWLINE;
        default:
            goto text;
        }
    }

textdone:
    state->ptr = x;
    *s = 0;
    return T_TEXT;
text:
    state->text = s = x;
textresume:
    for (;;) {
        switch (*x) {
        case 0:
            goto textdone;
        case ' ':
        case '\t':
        case '\r':
            x++;
            goto textdone;
        case '\n':
            state->nexttoken = T_NEWLINE;
            x++;
            goto textdone;
        case '"':
            x++;
            for (;;) {
                switch (*x) {
                case 0:
                        /* unterminated quoted thing */
                    state->ptr = x;
                    return T_EOF;
                case '"':
                    x++;
                    goto textresume;
                default:
                    *s++ = *x++;
                }
            }
            break;
        case '\\':
            x++;
            switch (*x) {
            case 0:
                goto textdone;
            case 'n':
                *s++ = '\n';
                break;
            case 'r':
                *s++ = '\r';
                break;
            case 't':
                *s++ = '\t';
                break;
            case '\\':
                *s++ = '\\';
                break;
            case '\r':
                    /* \ <cr> <lf> -> line continuation */
                if (x[1] != '\n') {
                    x++;
                    continue;
                }
            case '\n':
                    /* \ <lf> -> line continuation */
                state->line++;
                x++;
                    /* eat any extra whitespace */
                while((*x == ' ') || (*x == '\t')) x++;
                continue;
            default:
                    /* unknown escape -- just copy */
                *s++ = *x++;
            }
            continue;
        default:
            *s++ = *x++;
        }
    }
    return T_EOF;
}